

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::OptimizeTriangulation(dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes)

{
  dgTreeNode *pdVar1;
  dgRedBackNode *pdVar2;
  ulong uVar3;
  HaI32 HVar4;
  dgEdge *pdVar5;
  ulong uVar6;
  Iterator iter;
  dgPolyhedra buildConvex;
  dgPolyhedra flatFace;
  dgPolyhedra leftOver;
  HaI32 polygon [8192];
  Iterator local_80d0;
  Iterator local_80c0;
  dgPolyhedra local_80b0;
  dgPolyhedra local_8088;
  dgPolyhedra local_8060;
  HaI32 local_8038 [8194];
  
  dgPolyhedra(&local_8060);
  dgPolyhedra(&local_80b0);
  local_80d0.m_tree = &this->super_dgTree<dgEdge,_long>;
  local_80d0.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  do {
    do {
      pdVar2 = local_80d0.m_ptr;
      if ((dgTreeNode *)local_80d0.m_ptr == (dgTreeNode *)0x0) {
        EndFace(&local_80b0);
        if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
          __assert_fail("GetCount() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xd6f,
                        "void dgPolyhedra::OptimizeTriangulation(const hacd::HaF64 *const, hacd::HaI32)"
                       );
        }
        pdVar1 = (this->super_dgTree<dgEdge,_long>).m_head;
        (this->super_dgTree<dgEdge,_long>).m_head = local_80b0.super_dgTree<dgEdge,_long>.m_head;
        (this->super_dgTree<dgEdge,_long>).m_count = local_80b0.super_dgTree<dgEdge,_long>.m_count;
        local_80b0.super_dgTree<dgEdge,_long>.m_count = 0;
        local_80b0.super_dgTree<dgEdge,_long>.m_head = pdVar1;
        ~dgPolyhedra(&local_80b0);
        ~dgPolyhedra(&local_8060);
        return;
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_80d0,0);
    } while (((dgEdge *)((long)pdVar2 + 0x28))->m_incidentFace < 1);
    dgPolyhedra(&local_8088);
    MarkAdjacentCoplanarFaces(this,&local_8088,(dgEdge *)((long)pdVar2 + 0x28),vertex,strideInBytes)
    ;
    if (local_8088.super_dgTree<dgEdge,_long>.m_count != 0) {
      RefineTriangulation(&local_8088,vertex,strideInBytes >> 3);
      HVar4 = IncLRU(&local_8088);
      local_80c0.m_ptr = (dgRedBackNode *)0x0;
      local_80c0.m_tree = &local_8088.super_dgTree<dgEdge,_long>;
      local_80c0.m_ptr =
           &dgTree<dgEdge,_long>::Minimum(&local_8088.super_dgTree<dgEdge,_long>)->
            super_dgRedBackNode;
      while ((dgTreeNode *)local_80c0.m_ptr != (dgTreeNode *)0x0) {
        if ((((dgEdge *)((long)local_80c0.m_ptr + 0x28))->m_mark != HVar4) &&
           (0 < ((dgEdge *)((long)local_80c0.m_ptr + 0x28))->m_incidentFace)) {
          pdVar5 = (dgEdge *)((long)local_80c0.m_ptr + 0x28);
          uVar3 = 0;
          do {
            uVar6 = uVar3;
            local_8038[uVar6] = pdVar5->m_incidentVertex;
            if (uVar6 == 0x1fff) {
              __assert_fail("vertexCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xd60,
                            "void dgPolyhedra::OptimizeTriangulation(const hacd::HaF64 *const, hacd::HaI32)"
                           );
            }
            pdVar5->m_mark = HVar4;
            pdVar5 = pdVar5->m_next;
            uVar3 = uVar6 + 1;
          } while (pdVar5 != (dgEdge *)((long)local_80c0.m_ptr + 0x28));
          if (1 < uVar6) {
            AddFace(&local_80b0,(HaI32)(uVar6 + 1),local_8038);
          }
        }
        dgTree<dgEdge,_long>::Iterator::operator++(&local_80c0,0);
      }
    }
    local_80d0.m_ptr = &dgTree<dgEdge,_long>::Minimum(local_80d0.m_tree)->super_dgRedBackNode;
    ~dgPolyhedra(&local_8088);
  } while( true );
}

Assistant:

void dgPolyhedra::OptimizeTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes)
{
	hacd::HaI32 polygon[1024 * 8];
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	dgPolyhedra leftOver;
	dgPolyhedra buildConvex;

	buildConvex.BeginFace();
	dgPolyhedra::Iterator iter (*this);

	for (iter.Begin(); iter; ) {
		dgEdge* const edge = &(*iter);
		iter++;

		if (edge->m_incidentFace > 0) {
			dgPolyhedra flatFace;
			MarkAdjacentCoplanarFaces (flatFace, edge, vertex, strideInBytes);
			//HACD_ASSERT (flatFace.GetCount());

			if (flatFace.GetCount()) {
				//flatFace.Triangulate (vertex, strideInBytes, &leftOver);
				//HACD_ASSERT (!leftOver.GetCount());
				flatFace.RefineTriangulation (vertex, stride);

				hacd::HaI32 mark = flatFace.IncLRU();
				dgPolyhedra::Iterator iter (flatFace);
				for (iter.Begin(); iter; iter ++) {
					dgEdge* const edge = &(*iter);
					if (edge->m_mark != mark) {
						if (edge->m_incidentFace > 0) {
							dgEdge* ptr = edge;
							hacd::HaI32 vertexCount = 0;
							do {
								polygon[vertexCount] = ptr->m_incidentVertex;				
								vertexCount ++;
								HACD_ASSERT (vertexCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
								ptr->m_mark = mark;
								ptr = ptr->m_next;
							} while (ptr != edge);
							if (vertexCount >= 3) {
								buildConvex.AddFace (vertexCount, polygon);
							}
						}
					}
				}
			}
			iter.Begin();
		}
	}
	buildConvex.EndFace();
	HACD_ASSERT (GetCount() == 0);
	SwapInfo(buildConvex);
}